

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icetTests_mpi.c
# Opt level: O0

char * lowercase(char *string)

{
  int iVar1;
  size_t sVar2;
  size_t stringSize;
  char *p;
  char *new_string;
  char *string_local;
  
  sVar2 = strlen(string);
  string_local = (char *)malloc(sVar2 + 1);
  if (string_local == (char *)0x0) {
    string_local = (char *)0x0;
  }
  else {
    strcpy(string_local,string);
    for (stringSize = (size_t)string_local; *(char *)stringSize != '\0'; stringSize = stringSize + 1
        ) {
      iVar1 = tolower((int)*(char *)stringSize);
      *(char *)stringSize = (char)iVar1;
    }
  }
  return string_local;
}

Assistant:

static char* lowercase(const char* string)
{
  char *new_string;
  char *p;
  size_t stringSize;

  stringSize = CM_CAST(size_t, strlen(string) + 1);
  new_string = CM_CAST(char*, malloc(sizeof(char) * stringSize));

  if (new_string == CM_NULL) { /* NOLINT */
    return CM_NULL;            /* NOLINT */
  }
  strcpy(new_string, string);  /* NOLINT */
  for (p = new_string; *p != 0; ++p) {
    *p = CM_CAST(char, tolower(*p));
  }
  return new_string;
}